

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GcodePovray.cpp
# Opt level: O0

ostream * operator<<(ostream *os,CuttingPlane *vv)

{
  ostream *poVar1;
  CuttingPlane *vv_local;
  ostream *os_local;
  
  std::operator<<(os,"plane{\n");
  poVar1 = (ostream *)std::ostream::operator<<(os,(vv->normal).x);
  std::operator<<(poVar1,"*x");
  if (0.0 <= (vv->normal).y) {
    std::operator<<(os,"+");
  }
  poVar1 = (ostream *)std::ostream::operator<<(os,(vv->normal).y);
  std::operator<<(poVar1,"*y");
  if (0.0 <= (vv->normal).z) {
    std::operator<<(os,"+");
  }
  poVar1 = (ostream *)std::ostream::operator<<(os,(vv->normal).z);
  std::operator<<(poVar1,"*z");
  std::operator<<(os,",");
  poVar1 = (ostream *)std::ostream::operator<<(os,vv->start_distance);
  std::operator<<(poVar1,"\n");
  std::operator<<(os,"}\n");
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const CuttingPlane& vv)
{
  os << "plane{\n";
  os << vv.normal.x << "*x";
  if (vv.normal.y >= 0)
  {
    os << "+";
  }
  os << vv.normal.y << "*y";
  if (vv.normal.z >= 0)
  {
    os << "+";
  }
  os << vv.normal.z << "*z";

  os << ",";

  os << vv.start_distance << "\n";
  os << "}\n";
  return os;
}